

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::convert_float_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  char cVar1;
  runtime_error *this_00;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  char *comment;
  char print_buffer [32];
  char (*in_stack_fffffffffffffc70) [5];
  char *local_380;
  float local_374;
  undefined1 *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  undefined1 *local_358 [2];
  undefined1 local_348 [16];
  string local_338;
  char local_318 [40];
  string local_2f0;
  undefined1 *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [32];
  undefined1 *local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined1 local_280 [8];
  undefined4 local_278;
  undefined1 local_274;
  undefined1 local_273;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined4 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined1 local_240 [32];
  undefined1 *local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined1 local_208 [32];
  undefined7 local_1e8;
  undefined4 uStack_1e1;
  undefined8 local_1dc;
  undefined8 uStack_1d4;
  undefined4 local_1cc;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1c8;
  undefined **local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined4 local_174;
  undefined1 *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined1 local_158 [32];
  undefined1 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined1 local_120 [8];
  undefined4 local_118;
  undefined1 local_114;
  undefined1 local_113;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 auStack_e0 [32];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 auStack_a8 [32];
  undefined7 local_88;
  undefined4 uStack_81;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_374 = (c->m).c[col].r[row].f32;
  if ((!NAN(local_374) && !NAN(local_374)) && ABS(local_374) != INFINITY) {
    format_float_abi_cxx11_(&local_2f0,this,local_374);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if ((this->backend).float_literal_suffix != true) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  uVar4 = 0x81;
  if ((this->options).es != false) {
    uVar4 = 299;
  }
  if (uVar4 < (this->options).version) {
    local_2d0 = local_2b8;
    local_2f0._M_string_length._0_4_ = 0;
    local_2f0._M_dataplus._M_p = (pointer)&PTR__SPIRType_0048ff28;
    local_2f0._M_string_length._4_4_ = 0x16;
    local_2f0.field_2._12_4_ = 1;
    local_2c8 = 0;
    local_2c0 = 8;
    local_298 = local_280;
    local_290 = 0;
    local_288 = 8;
    local_278 = 0;
    local_274 = 0;
    local_273 = 0;
    local_270 = 0;
    uStack_268 = 0;
    local_260 = 8;
    local_360 = local_240;
    local_250 = 0;
    local_248 = 8;
    local_368 = local_208;
    local_218 = 0;
    local_210 = 8;
    local_1e8 = 0;
    uStack_1e1 = 0;
    local_1dc = 0;
    uStack_1d4 = 0;
    local_1cc = 0;
    local_1c8._M_buckets = &local_1c8._M_single_bucket;
    local_170 = local_158;
    local_188 = 0x1500000000;
    local_190 = &PTR__SPIRType_0048ff28;
    local_174 = 1;
    local_168 = 0;
    local_160 = 8;
    local_130 = 0;
    local_128 = 8;
    local_118 = 0;
    local_114 = 0;
    local_113 = 0;
    local_110 = 0;
    uStack_108 = 0;
    local_100 = 8;
    local_370 = auStack_e0;
    local_f0 = 0;
    local_e8 = 8;
    local_b8 = 0;
    local_b0 = 8;
    local_88 = 0;
    uStack_81 = 0;
    local_6c = 0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_7c = 0;
    uStack_74 = 0;
    local_1c8._M_bucket_count = 1;
    local_1c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1c8._M_element_count = 0;
    local_68._M_bucket_count = 1;
    local_1c8._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_180 = 0x2000000008;
    local_1c8._M_rehash_policy._M_next_resize = 0;
    local_1c8._M_single_bucket = (__node_base_ptr)0x0;
    local_2f0.field_2._M_allocated_capacity._0_4_ = 0xd;
    local_178 = 1;
    local_2f0.field_2._4_8_ = 0x100000020;
    local_258 = local_360;
    local_220 = local_368;
    local_138 = local_120;
    local_f8 = local_370;
    local_c0 = auStack_a8;
    snprintf(local_318,0x20,"0x%xu",(ulong)(c->m).c[col].r[row].u32);
    local_380 = "inf";
    if (-INFINITY < local_374) {
      if (NAN(local_374)) {
        local_380 = "nan";
      }
    }
    else {
      local_380 = "-inf";
    }
    (*(this->super_Compiler)._vptr_Compiler[0x3c])(local_358,this,&local_2f0,&local_190);
    join<std::__cxx11::string,char_const(&)[2],char(&)[32],char_const(&)[5],char_const*&,char_const(&)[5]>
              (&local_338,(spirv_cross *)local_358,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x398789,
               (char (*) [2])local_318,(char (*) [32])" /* ",(char (*) [5])&local_380,
               (char **)" */)",in_stack_fffffffffffffc70);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p);
    }
    if (local_358[0] != local_348) {
      operator_delete(local_358[0]);
    }
    local_190 = &PTR__SPIRType_0048ff28;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != auStack_a8) {
      free(local_c0);
    }
    local_f0 = 0;
    if (local_f8 != local_370) {
      free(local_f8);
    }
    local_130 = 0;
    if (local_138 != local_120) {
      free(local_138);
    }
    local_168 = 0;
    if (local_170 != local_158) {
      free(local_170);
    }
    local_2f0._M_dataplus._M_p = (pointer)&PTR__SPIRType_0048ff28;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1c8);
    local_218 = 0;
    if (local_220 != local_368) {
      free(local_220);
    }
    local_250 = 0;
    if (local_258 != local_360) {
      free(local_258);
    }
    local_290 = 0;
    if (local_298 != local_280) {
      free(local_298);
    }
    local_2c8 = 0;
    if (local_2d0 == local_2b8) {
      return __return_storage_ptr__;
    }
    free(local_2d0);
    return __return_storage_ptr__;
  }
  if (local_374 < INFINITY) {
    if (local_374 <= -INFINITY) {
      pcVar2 = "(-1.0 / 0.0)";
      if ((this->backend).float_literal_suffix != false) {
        pcVar2 = "(-1.0f / 0.0f)";
      }
      goto LAB_002d30e5;
    }
    if (!NAN(local_374)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,"Cannot represent non-finite floating point constant.");
      *(undefined ***)this_00 = &PTR__runtime_error_0048ff00;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    cVar1 = (this->backend).float_literal_suffix;
    pcVar3 = "(0.0f / 0.0f)";
    pcVar2 = "(0.0 / 0.0)";
  }
  else {
    cVar1 = (this->backend).float_literal_suffix;
    pcVar3 = "(1.0f / 0.0f)";
    pcVar2 = "(1.0 / 0.0)";
  }
  if (cVar1 != '\0') {
    pcVar2 = pcVar3;
  }
LAB_002d30e5:
  ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_float_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f32(col, row);

	if (std::isnan(float_value) || std::isinf(float_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type { OpTypeFloat };
			SPIRType in_type { OpTypeInt };
			out_type.basetype = SPIRType::Float;
			in_type.basetype = SPIRType::UInt;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 32;
			in_type.width = 32;

			char print_buffer[32];
#ifdef _WIN32
			sprintf(print_buffer, "0x%xu", c.scalar(col, row));
#else
			snprintf(print_buffer, sizeof(print_buffer), "0x%xu", c.scalar(col, row));
#endif

			const char *comment = "inf";
			if (float_value == -numeric_limits<float>::infinity())
				comment = "-inf";
			else if (std::isnan(float_value))
				comment = "nan";
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, " /* ", comment, " */)");
		}
		else
		{
			if (float_value == numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(1.0f / 0.0f)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (float_value == -numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(-1.0f / 0.0f)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(float_value))
			{
				if (backend.float_literal_suffix)
					res = "(0.0f / 0.0f)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = format_float(float_value);
		if (backend.float_literal_suffix)
			res += "f";
	}

	return res;
}